

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk84(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk84 *peVar4;
  envy_bios_power_unk84_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk84 *unk84;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk84;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk84.version);
    if ((bios->power).unk84.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk84.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk84.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk84.entriesnum);
      (bios->power).unk84.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk84_entry *)malloc((ulong)(bios->power).unk84.entriesnum << 2);
      (bios->power).unk84.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk84.entriesnum; data = data + 1) {
        (bios->power).unk84.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk84.hlen + data * (bios->power).unk84.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER MS table version 0x%x\n",(ulong)(bios->power).unk84.version
             );
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk84(struct envy_bios *bios) {
	struct envy_bios_power_unk84 *unk84 = &bios->power.unk84;
	int i, err = 0;

	if (!unk84->offset)
		return -EINVAL;

	bios_u8(bios, unk84->offset + 0x0, &unk84->version);
	switch(unk84->version) {
	case 0x10:
		err |= bios_u8(bios, unk84->offset + 0x1, &unk84->hlen);
		err |= bios_u8(bios, unk84->offset + 0x2, &unk84->rlen);
		err |= bios_u8(bios, unk84->offset + 0x3, &unk84->entriesnum);
		unk84->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER MS table version 0x%x\n", unk84->version);
		return -EINVAL;
	};

	err = 0;
	unk84->entries = malloc(unk84->entriesnum * sizeof(struct envy_bios_power_unk84_entry));
	for (i = 0; i < unk84->entriesnum; i++) {
		uint32_t data = unk84->offset + unk84->hlen + i * unk84->rlen;

		unk84->entries[i].offset = data;
	}

	return 0;
}